

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_read_units(lys_module *module,void *node,char *value,yytokentype type)

{
  int iVar1;
  LY_ERR *pLVar2;
  char *where;
  char **target;
  
  if ((int)type < 0x153) {
    if (type == LEAF_KEYWORD) {
      iVar1 = yang_check_string(module,(char **)((long)node + 0xb8),"units","leaf",value,
                                (lys_node *)node);
      return iVar1;
    }
    if (type == LEAF_LIST_KEYWORD) {
      iVar1 = yang_check_string(module,(char **)((long)node + 0xb8),"units","leaflist",value,
                                (lys_node *)node);
      return iVar1;
    }
    if (type != TYPEDEF_KEYWORD) {
LAB_0014cc91:
      free(value);
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
             ,0x1ce);
      return 1;
    }
    target = (char **)((long)node + 0x28);
    where = "typedef";
  }
  else {
    if (((type != ADD_KEYWORD) && (type != DELETE_KEYWORD)) && (type != REPLACE_KEYWORD))
    goto LAB_0014cc91;
    target = (char **)((long)node + 0x30);
    where = "deviate";
  }
  iVar1 = yang_check_string(module,target,"units",where,value,(lys_node *)0x0);
  return iVar1;
}

Assistant:

int
yang_read_units(struct lys_module *module, void *node, char *value, enum yytokentype type)
{
    int ret;

    switch (type) {
    case LEAF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_node_leaf *) node)->units, "units", "leaf", value, node);
        break;
    case LEAF_LIST_KEYWORD:
        ret = yang_check_string(module, &((struct lys_node_leaflist *) node)->units, "units", "leaflist", value, node);
        break;
    case TYPEDEF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_tpdf *) node)->units, "units", "typedef", value, NULL);
        break;
    case ADD_KEYWORD:
    case REPLACE_KEYWORD:
    case DELETE_KEYWORD:
        ret = yang_check_string(module, &((struct lys_deviate *) node)->units, "units", "deviate", value, NULL);
        break;
    default:
        free(value);
        LOGINT;
        ret = EXIT_FAILURE;
        break;
    }
    return ret;
}